

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpointingdevice.cpp
# Opt level: O0

bool __thiscall
QPointingDevicePrivate::addPassiveGrabber
          (QPointingDevicePrivate *this,QPointerEvent *event,QEventPoint *point,QObject *grabber)

{
  QObject *_t1;
  EventPointData *pEVar1;
  QDebug *pQVar2;
  undefined8 in_RSI;
  QPointingDevicePrivate *in_RDI;
  long in_FS_OFFSET;
  EventPointData *persistentPoint;
  QPointingDevice *q;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  undefined4 in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  undefined4 in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff04;
  QPointingDevicePrivate *in_stack_ffffffffffffff08;
  QList<QPointer<QObject>_> *_t4;
  QMessageLogger *in_stack_ffffffffffffff10;
  GrabTransition _t2;
  int id;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  bool bVar3;
  QDebug *in_stack_ffffffffffffff50;
  QDebug local_80;
  QDebug local_78;
  QDebug local_70;
  QDebug local_68;
  QDebug local_60 [5];
  QDebug local_38;
  QDebug local_30;
  QDebug local_28 [2];
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  id = (int)((ulong)in_RSI >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  _t1 = (QObject *)q_func(in_RDI);
  QEventPoint::id((QEventPoint *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
  pEVar1 = queryPointById(in_stack_ffffffffffffff08,id);
  if (pEVar1 == (EventPointData *)0x0) {
    QMessageLogger::QMessageLogger
              (in_stack_ffffffffffffff10,(char *)in_stack_ffffffffffffff08,in_stack_ffffffffffffff04
               ,(char *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    QMessageLogger::warning();
    pQVar2 = QDebug::operator<<((QDebug *)in_RDI,
                                (char *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48
                                                ));
    QDebug::QDebug(&local_30,pQVar2);
    ::operator<<(in_stack_ffffffffffffff50,
                 (QEventPoint *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
    QDebug::~QDebug(local_28);
    QDebug::~QDebug(&local_30);
    QDebug::~QDebug(&local_38);
    bVar3 = false;
  }
  else {
    bVar3 = QListSpecialMethodsBase<QPointer<QObject>>::contains<QObject*>
                      ((QListSpecialMethodsBase<QPointer<QObject>_> *)
                       CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                       (QObject **)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    if (bVar3) {
      bVar3 = false;
    }
    else {
      QtPrivateLogging::lcPointerGrab();
      bVar3 = QLoggingCategory::isDebugEnabled((QLoggingCategory *)0x4088cb);
      if (bVar3) {
        local_18 = &DAT_aaaaaaaaaaaaaaaa;
        local_10 = &DAT_aaaaaaaaaaaaaaaa;
        QtPrivateLogging::lcPointerGrab();
        anon_unknown.dwarf_846b95::QLoggingCategoryMacroHolder<(QtMsgType)0>::
        QLoggingCategoryMacroHolder
                  ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)
                   CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                   (QLoggingCategory *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8)
                  );
        while (bVar3 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                                 ((QLoggingCategoryMacroHolder *)&local_18), bVar3) {
          anon_unknown.dwarf_846b95::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                    ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x40892e);
          QMessageLogger::QMessageLogger
                    (in_stack_ffffffffffffff10,(char *)in_stack_ffffffffffffff08,
                     in_stack_ffffffffffffff04,
                     (char *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                     (char *)0x408944);
          QMessageLogger::debug();
          QDebug::operator<<((QDebug *)in_stack_ffffffffffffff10,
                             (QString *)in_stack_ffffffffffffff08);
          in_stack_ffffffffffffff10 =
               (QMessageLogger *)
               QDebug::operator<<((QDebug *)in_RDI,
                                  (char *)CONCAT17(in_stack_ffffffffffffff4f,
                                                   in_stack_ffffffffffffff48));
          QEventPoint::id((QEventPoint *)
                          CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
          pQVar2 = QDebug::operator<<((QDebug *)
                                      CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                                      in_stack_fffffffffffffefc);
          QDebug::QDebug(&local_78,pQVar2);
          QEventPoint::state((QEventPoint *)
                             CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
          ::operator<<((QDebug *)in_stack_ffffffffffffff10,
                       (State)((ulong)in_stack_ffffffffffffff08 >> 0x38));
          pQVar2 = QDebug::operator<<((QDebug *)in_RDI,
                                      (char *)CONCAT17(in_stack_ffffffffffffff4f,
                                                       in_stack_ffffffffffffff48));
          QDebug::QDebug(&local_68,pQVar2);
          ::operator<<((Stream *)local_60,(QObject *)&local_68);
          QDebug::~QDebug(local_60);
          QDebug::~QDebug(&local_68);
          QDebug::~QDebug(&local_70);
          QDebug::~QDebug(&local_78);
          QDebug::~QDebug(&local_80);
          local_10 = (undefined1 *)((ulong)local_10 & 0xffffffffffffff00);
        }
      }
      _t4 = &pEVar1->passiveGrabbers;
      QPointer<QObject>::QPointer<void>
                ((QPointer<QObject> *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                 (QObject *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      _t2 = (GrabTransition)((ulong)pEVar1 >> 0x20);
      QList<QPointer<QObject>_>::operator<<
                ((QList<QPointer<QObject>_> *)
                 CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                 (rvalue_ref)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      QPointer<QObject>::~QPointer((QPointer<QObject> *)0x408a92);
      QPointingDevice::grabChanged
                ((QPointingDevice *)in_stack_ffffffffffffff10,_t1,_t2,(QPointerEvent *)in_RDI,
                 (QEventPoint *)_t4);
      bVar3 = true;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return bVar3;
}

Assistant:

bool QPointingDevicePrivate::addPassiveGrabber(const QPointerEvent *event, const QEventPoint &point, QObject *grabber)
{
    Q_Q(QPointingDevice);
    auto persistentPoint = queryPointById(point.id());
    if (!persistentPoint) {
        qWarning() << "point is not in activePoints" << point;
        return false;
    }
    if (persistentPoint->passiveGrabbers.contains(grabber))
        return false;
    if (Q_UNLIKELY(lcPointerGrab().isDebugEnabled())) {
        qCDebug(lcPointerGrab) << name << "point" << point.id() << point.state()
                               << ": grab (passive)" << grabber;
    }
    persistentPoint->passiveGrabbers << grabber;
    emit q->grabChanged(grabber, QPointingDevice::GrabPassive, event, point);
    return true;
}